

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# average.hpp
# Opt level: O2

void __thiscall
vista::circular::example::average<double,_4UL>::push(average<double,_4UL> *this,value_type input)

{
  circular_view<double,_4UL> *this_00;
  reference pdVar1;
  value_type vVar2;
  
  this_00 = &(this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>;
  vVar2 = input;
  if ((this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>.member.size == 4) {
    pdVar1 = circular_view<double,_4UL>::front(this_00);
    vVar2 = input - *pdVar1;
  }
  this->sum = vVar2 + this->sum;
  circular_view<double,_4UL>::push_back(this_00,input);
  return;
}

Assistant:

void push(value_type input) noexcept(std::is_nothrow_move_assignable<value_type>::value)
    {
        // Update the running sum
        if (window::full())
        {
            // Undo the effect of the entry leaving the window
            sum += input - window::front();
        }
        else
        {
            sum += input;
        }
        // Remember the input value for later use
        window::push_back(input);
    }